

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_tIME(ucvector *out,LodePNGTime *time)

{
  uchar *puStack_28;
  uint error;
  uchar *chunk;
  LodePNGTime *time_local;
  ucvector *out_local;
  
  chunk = (uchar *)time;
  time_local = (LodePNGTime *)out;
  out_local._4_4_ = lodepng_chunk_init(&stack0xffffffffffffffd8,out,7,"tIME");
  if (out_local._4_4_ == 0) {
    puStack_28[8] = (uchar)((uint)*(undefined4 *)chunk >> 8);
    puStack_28[9] = (uchar)*(undefined4 *)chunk;
    puStack_28[10] = (uchar)*(undefined4 *)(chunk + 4);
    puStack_28[0xb] = (uchar)*(undefined4 *)(chunk + 8);
    puStack_28[0xc] = (uchar)*(undefined4 *)(chunk + 0xc);
    puStack_28[0xd] = (uchar)*(undefined4 *)(chunk + 0x10);
    puStack_28[0xe] = (uchar)*(undefined4 *)(chunk + 0x14);
    lodepng_chunk_generate_crc(puStack_28);
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned addChunk_tIME(ucvector* out, const LodePNGTime* time) {
  unsigned char* chunk;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 7, "tIME"));
  chunk[8] = (unsigned char)(time->year >> 8);
  chunk[9] = (unsigned char)(time->year & 255);
  chunk[10] = (unsigned char)time->month;
  chunk[11] = (unsigned char)time->day;
  chunk[12] = (unsigned char)time->hour;
  chunk[13] = (unsigned char)time->minute;
  chunk[14] = (unsigned char)time->second;
  lodepng_chunk_generate_crc(chunk);
  return 0;
}